

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O1

void ctemplate_htmlparser::jsparser_buffer_append_str(jsparser_ctx *js,char *str)

{
  char chr;
  char *pcVar1;
  
  if (js == (jsparser_ctx *)0x0) {
    __assert_fail("js != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0xc5,
                  "void ctemplate_htmlparser::jsparser_buffer_append_str(jsparser_ctx *, const char *)"
                 );
  }
  if (str != (char *)0x0) {
    chr = *str;
    if (chr != '\0') {
      pcVar1 = str + 1;
      do {
        jsparser_buffer_append_chr(js,chr);
        chr = *pcVar1;
        pcVar1 = pcVar1 + 1;
      } while (chr != '\0');
    }
    return;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0xc6,
                "void ctemplate_htmlparser::jsparser_buffer_append_str(jsparser_ctx *, const char *)"
               );
}

Assistant:

void jsparser_buffer_append_str(jsparser_ctx *js, const char *str)
{
  assert(js != NULL);
  assert(str != NULL);

  while(*str != '\0') {
    jsparser_buffer_append_chr(js, *str++);
  }
}